

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int io_lines(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  FILE **ppFVar3;
  FILE *pFVar4;
  char *__modes;
  char *filename;
  
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) {
    lua_rawgeti(L,-0x2711,1);
    f_lines(L);
  }
  else {
    pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
    ppFVar3 = newfile(L);
    pFVar4 = fopen64(pcVar2,"r");
    *ppFVar3 = (FILE *)pFVar4;
    if (pFVar4 == (FILE *)0x0) {
      fileerror(L,(int)pcVar2,filename);
      pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
      __modes = luaL_optlstring(L,2,"r",(size_t *)0x0);
      ppFVar3 = newfile(L);
      pFVar4 = fopen64(pcVar2,__modes);
      *ppFVar3 = (FILE *)pFVar4;
      if (pFVar4 != (FILE *)0x0) {
        return 1;
      }
      iVar1 = pushresult(L,0,pcVar2);
      return iVar1;
    }
    aux_lines(L,(int)((ulong)((long)L->top - (long)L->base) >> 4),1);
  }
  return 1;
}

Assistant:

static int io_lines(lua_State*L){
if(lua_isnoneornil(L,1)){
lua_rawgeti(L,(-10001),1);
return f_lines(L);
}
else{
const char*filename=luaL_checkstring(L,1);
FILE**pf=newfile(L);
*pf=fopen(filename,"r");
if(*pf==NULL)
fileerror(L,1,filename);
aux_lines(L,lua_gettop(L),1);
return 1;
}
}